

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BeginTransaction(Parse *pParse,int type)

{
  sqlite3 *psVar1;
  int iVar2;
  Vdbe *p;
  int local_2c;
  int i;
  Vdbe *v;
  sqlite3 *db;
  int type_local;
  Parse *pParse_local;
  
  psVar1 = pParse->db;
  iVar2 = sqlite3AuthCheck(pParse,0x16,"BEGIN",(char *)0x0,(char *)0x0);
  if ((iVar2 == 0) && (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
    if (type != 7) {
      for (local_2c = 0; local_2c < psVar1->nDb; local_2c = local_2c + 1) {
        sqlite3VdbeAddOp2(p,2,local_2c,(type == 9) + 1);
        sqlite3VdbeUsesBtree(p,local_2c);
      }
    }
    sqlite3VdbeAddOp0(p,1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTransaction(Parse *pParse, int type){
  sqlite3 *db;
  Vdbe *v;
  int i;

  assert( pParse!=0 );
  db = pParse->db;
  assert( db!=0 );
  if( sqlite3AuthCheck(pParse, SQLITE_TRANSACTION, "BEGIN", 0, 0) ){
    return;
  }
  v = sqlite3GetVdbe(pParse);
  if( !v ) return;
  if( type!=TK_DEFERRED ){
    for(i=0; i<db->nDb; i++){
      sqlite3VdbeAddOp2(v, OP_Transaction, i, (type==TK_EXCLUSIVE)+1);
      sqlite3VdbeUsesBtree(v, i);
    }
  }
  sqlite3VdbeAddOp0(v, OP_AutoCommit);
}